

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O1

void __thiscall
tsbp::Packing2D::Initialize
          (Packing2D *this,vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> *items,Bin *bin
          )

{
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  pointer pRVar4;
  double dVar5;
  allocator_type local_49;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  value_type_conflict2 local_28;
  
  CLI::std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::reserve
            (&this->Items,
             (long)(items->super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(items->super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 5);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&local_48,
             (long)(items->super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(items->super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 5,0,
             (allocator<unsigned_long> *)&local_28);
  if (&local_48 != &this->PlacedItems) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
              (&(this->PlacedItems).m_bits,&local_48);
    puVar2 = local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    puVar1 = local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (this->PlacedItems).m_num_bits = local_48.m_num_bits;
    local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1,(long)puVar2 - (long)puVar1);
    }
    if (local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      __assert_fail("(b.m_bits = buffer_type()).empty()",
                    "/usr/include/boost/dynamic_bitset/dynamic_bitset.hpp",0x2e7,
                    "dynamic_bitset<Block, Allocator> &boost::dynamic_bitset<>::operator=(dynamic_bitset<Block, Allocator> &&) [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                   );
    }
    local_48.m_num_bits = 0;
  }
  bVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_check_invariants
                    (&local_48);
  if (bVar3) {
    if (local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.m_bits.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.m_bits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.m_bits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    dVar5 = 0.0;
    for (pRVar4 = (items->super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        pRVar4 != (items->super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>).
                  _M_impl.super__Vector_impl_data._M_finish; pRVar4 = pRVar4 + 1) {
      dVar5 = dVar5 + pRVar4->Area;
    }
    this->RemainingItemAreaToPlace = dVar5;
    local_28 = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_48.m_bits,(long)(bin->super_Rectangle).Dy + 1,&local_28,&local_49);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
              (&this->PlacedAreaVector,&local_48);
    if (local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.m_bits.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.m_bits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.m_bits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    local_28 = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_48.m_bits,(long)(bin->super_Rectangle).Dy + 1,&local_28,&local_49);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
              (&this->DeactivatedAreaVector,&local_48);
    if (local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.m_bits.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.m_bits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.m_bits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    this->ReducedItemInfeasiblePlacementPoints = 0;
    return;
  }
  __assert_fail("m_check_invariants()","/usr/include/boost/dynamic_bitset/dynamic_bitset.hpp",0x2be,
                "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
               );
}

Assistant:

void Packing2D::Initialize(const std::vector<Rectangle>& items, const Bin& bin)
{
    Items.reserve(items.size());
    PlacedItems = boost::dynamic_bitset<>(items.size());
    RemainingItemAreaToPlace = std::accumulate(items.begin(), items.end(), 0.0, [](double volume, const Rectangle& i)
                                               { return volume + i.Area; });
    PlacedAreaVector = std::vector<size_t>(bin.Dy + 1, 0);
    DeactivatedAreaVector = std::vector<size_t>(bin.Dy + 1, 0);
    ReducedItemInfeasiblePlacementPoints = 0;
}